

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

void tb_invalidate_phys_addr_aarch64(AddressSpace *as,hwaddr addr,MemTxAttrs attrs)

{
  MemoryRegion *mr;
  ram_addr_t rVar1;
  hwaddr l;
  hwaddr local_18 [2];
  
  local_18[1] = 1;
  local_18[0] = addr;
  mr = address_space_translate(as,addr,local_18,local_18 + 1,false,attrs);
  if (mr->ram == true) {
    rVar1 = memory_region_get_ram_addr_aarch64(mr);
    tb_invalidate_phys_page_range_aarch64
              ((uc_struct_conflict2 *)as->uc,local_18[0] + rVar1,local_18[0] + rVar1 + 1);
  }
  return;
}

Assistant:

void tb_invalidate_phys_addr(AddressSpace *as, hwaddr addr, MemTxAttrs attrs)
{
    ram_addr_t ram_addr;
    MemoryRegion *mr;
    hwaddr l = 1;

    mr = address_space_translate(as, addr, &addr, &l, false, attrs);
    if (!memory_region_is_ram(mr)) {
        return;
    }

    ram_addr = memory_region_get_ram_addr(mr) + addr;
    tb_invalidate_phys_page_range(as->uc, ram_addr, ram_addr + 1);
}